

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

void __thiscall
FIX::Message::setString
          (Message *this,string *string,bool doValidation,DataDictionary *pSessionDataDictionary,
          DataDictionary *pApplicationDataDictionary)

{
  int field_00;
  char cVar1;
  bool bVar2;
  void *pvVar3;
  InvalidMessage *this_00;
  undefined7 in_register_00000011;
  size_type pos;
  MsgType msg;
  FieldBase field;
  int local_14c;
  string local_148;
  size_type local_128;
  undefined4 local_120;
  int local_11c;
  FieldMap *local_118;
  Fields *local_110;
  Fields *local_108;
  FieldMap *local_100;
  Fields *local_f8;
  undefined1 local_f0 [16];
  string local_e0;
  _Alloc_hider local_c0;
  size_type local_b8;
  size_t local_a0;
  int local_98;
  FieldBase local_90;
  
  local_120 = (undefined4)CONCAT71(in_register_00000011,doValidation);
  clear(this);
  local_128 = 0;
  StringField::StringField((StringField *)local_f0,0x23);
  local_f0._0_8_ = &PTR__FieldBase_001ed708;
  if (string->_M_string_length != 0) {
    local_108 = &(this->super_FieldMap).m_fields;
    local_118 = &(this->m_trailer).super_FieldMap;
    local_110 = &(this->m_trailer).super_FieldMap.m_fields;
    local_100 = &(this->m_header).super_FieldMap;
    local_f8 = &(this->m_header).super_FieldMap.m_fields;
    cVar1 = (char)local_120;
    local_14c = 0;
    local_11c = 0;
    do {
      extractField(&local_90,this,string,&local_128,pSessionDataDictionary,
                   pApplicationDataDictionary,(Group *)0x0);
      field_00 = local_90.m_tag;
      if (local_11c < 3) {
        if ((&headerOrder)[local_11c] != local_90.m_tag && cVar1 == '\x01') {
          this_00 = (InvalidMessage *)__cxa_allocate_exception(0x50);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"Header fields out of order","");
          InvalidMessage::InvalidMessage(this_00,&local_148);
          __cxa_throw(this_00,&InvalidMessage::typeinfo,FIX::Exception::~Exception);
        }
        local_11c = local_11c + 1;
      }
      bVar2 = isHeaderField(local_90.m_tag,pSessionDataDictionary);
      if (bVar2) {
        if (local_14c != 0) {
          if (this->m_tag == 0) {
            this->m_tag = field_00;
          }
          this->m_validStructure = false;
        }
        if (field_00 == 0x23) {
          std::__cxx11::string::_M_assign((string *)(local_f0 + 0x10));
          local_a0 = 0;
          local_98 = 0;
          local_b8 = 0;
          *local_c0._M_p = '\0';
          if ((local_e0._M_string_length == 1) &&
             (pvVar3 = memchr("0A12345",(int)*local_e0._M_dataplus._M_p,8), pvVar3 != (void *)0x0))
          {
            pApplicationDataDictionary = pSessionDataDictionary;
          }
        }
        std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::push_back(local_f8,&local_90);
        if (pSessionDataDictionary != (DataDictionary *)0x0) {
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"_header_","");
          setGroup(this,&local_148,&local_90,string,&local_128,local_100,pSessionDataDictionary);
LAB_0018457d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        bVar2 = isTrailerField(field_00,pSessionDataDictionary);
        if (bVar2) {
          std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::push_back
                    (local_110,&local_90);
          local_14c = 2;
          if (pSessionDataDictionary != (DataDictionary *)0x0) {
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"_trailer_","");
            setGroup(this,&local_148,&local_90,string,&local_128,local_118,pSessionDataDictionary);
            goto LAB_0018457d;
          }
        }
        else {
          if (local_14c == 2) {
            if (this->m_tag == 0) {
              this->m_tag = field_00;
            }
            this->m_validStructure = false;
          }
          std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::push_back
                    (local_108,&local_90);
          local_14c = 1;
          if (pApplicationDataDictionary == (DataDictionary *)0x0) {
            pApplicationDataDictionary = (DataDictionary *)0x0;
          }
          else {
            setGroup(this,(string *)(local_f0 + 0x10),&local_90,string,&local_128,
                     &this->super_FieldMap,pApplicationDataDictionary);
          }
        }
      }
      FieldBase::~FieldBase(&local_90);
    } while (local_128 < string->_M_string_length);
  }
  FieldMap::sortFields(&(this->m_header).super_FieldMap);
  FieldMap::sortFields(&this->super_FieldMap);
  FieldMap::sortFields(&(this->m_trailer).super_FieldMap);
  if ((char)local_120 != '\0') {
    validate(this);
  }
  FieldBase::~FieldBase((FieldBase *)local_f0);
  return;
}

Assistant:

void Message::setString( const std::string& string,
                         bool doValidation,
                         const DataDictionary* pSessionDataDictionary,
                         const DataDictionary* pApplicationDataDictionary )
EXCEPT ( InvalidMessage )
{
  clear();

  std::string::size_type pos = 0;
  int count = 0;

  FIX::MsgType msg;

  field_type type = header;

  while ( pos < string.size() )
  {
    FieldBase field = extractField( string, pos, pSessionDataDictionary, pApplicationDataDictionary );
    if ( count < 3 && headerOrder[ count++ ] != field.getTag() )
      if ( doValidation ) throw InvalidMessage("Header fields out of order");

    if ( isHeaderField( field, pSessionDataDictionary ) )
    {
      if ( type != header )
      {
        if(m_tag == 0) m_tag = field.getTag();
        m_validStructure = false;
      }

      if ( field.getTag() == FIELD::MsgType )
      {
        msg.setString( field.getString() );
        if ( isAdminMsgType( msg ) )
        {
          pApplicationDataDictionary = pSessionDataDictionary;
#ifdef HAVE_EMX
          m_subMsgType.assign(msg);
        }
        else
        {
          std::string::size_type equalSign = string.find("\0019426=", pos);
          if (equalSign == std::string::npos)
            throw InvalidMessage("EMX message type (9426) not found");

          equalSign += 6;
          std::string::size_type soh = string.find_first_of('\001', equalSign);
          if (soh == std::string::npos)
            throw InvalidMessage("EMX message type (9426) soh char not found");
          m_subMsgType.assign(string.substr(equalSign, soh - equalSign ));
#endif
        }
      }

      m_header.appendField( field );

      if ( pSessionDataDictionary )
        setGroup( "_header_", field, string, pos, getHeader(), *pSessionDataDictionary );
    }
    else if ( isTrailerField( field, pSessionDataDictionary ) )
    {
      type = trailer;
      m_trailer.appendField( field );

      if ( pSessionDataDictionary )
        setGroup( "_trailer_", field, string, pos, getTrailer(), *pSessionDataDictionary );
    }
    else
    {
      if ( type == trailer )
      {
        if(m_tag == 0) m_tag = field.getTag();
        m_validStructure = false;
      }

      type = body;
      appendField( field );

      if ( pApplicationDataDictionary )
#ifdef HAVE_EMX
        setGroup(m_subMsgType, field, string, pos, *this, *pApplicationDataDictionary);
#else
        setGroup( msg, field, string, pos, *this, *pApplicationDataDictionary );
#endif
    }
  }

  // sort fields
  m_header.sortFields();
  sortFields();
  m_trailer.sortFields();

  if ( doValidation )
    validate();
}